

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::considerColScaling
          (HighsSparseMatrix *this,HighsInt max_scale_factor_exponent,double *col_scale)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  double *pdVar5;
  long in_RDX;
  int in_ESI;
  HighsSparseMatrix *in_RDI;
  double dVar6;
  HighsInt iEl_1;
  double col_scale_value;
  HighsInt iEl;
  double col_max_value;
  HighsInt iCol;
  double max_allow_col_scale;
  double min_allow_col_scale;
  double min_allow_scale;
  double max_allow_scale;
  double log2;
  int local_6c;
  double local_68;
  value_type local_60;
  int local_54;
  double local_50;
  int local_44;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_20 = log(2.0);
  local_40 = pow(2.0,(double)local_c);
  local_38 = 1.0 / local_40;
  local_30 = local_38;
  local_28 = local_40;
  bVar2 = isColwise(in_RDI);
  if (bVar2) {
    for (local_44 = 0; local_44 < in_RDI->num_col_; local_44 = local_44 + 1) {
      local_50 = 0.0;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_44);
      for (local_54 = *pvVar3; iVar1 = local_54,
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_44 + 1)), iVar1 < *pvVar3;
          local_54 = local_54 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->value_,(long)local_54);
        local_60 = ABS(*pvVar4);
        pdVar5 = std::max<double>(&local_60,&local_50);
        local_50 = *pdVar5;
      }
      if ((local_50 != 0.0) || (NAN(local_50))) {
        local_68 = 1.0 / local_50;
        dVar6 = log(local_68);
        dVar6 = floor(dVar6 / local_20 + 0.5);
        local_68 = pow(2.0,dVar6);
        pdVar5 = std::max<double>(&local_38,&local_68);
        pdVar5 = std::min<double>(pdVar5,&local_40);
        local_68 = *pdVar5;
        *(double *)(local_18 + (long)local_44 * 8) = local_68;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_44);
        for (local_6c = *pvVar3;
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->start_,(long)(local_44 + 1)), local_6c < *pvVar3;
            local_6c = local_6c + 1) {
          dVar6 = *(double *)(local_18 + (long)local_44 * 8);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->value_,(long)local_6c);
          *pvVar4 = dVar6 * *pvVar4;
        }
      }
      else {
        *(undefined8 *)(local_18 + (long)local_44 * 8) = 0x3ff0000000000000;
      }
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::considerColScaling(
    const HighsInt max_scale_factor_exponent, double* col_scale) {
  const double log2 = log(2.0);
  const double max_allow_scale = pow(2.0, max_scale_factor_exponent);
  const double min_allow_scale = 1 / max_allow_scale;

  const double min_allow_col_scale = min_allow_scale;
  const double max_allow_col_scale = max_allow_scale;

  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      double col_max_value = 0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        col_max_value = max(fabs(this->value_[iEl]), col_max_value);
      if (col_max_value) {
        double col_scale_value = 1 / col_max_value;
        // Convert the col scale factor to the nearest power of two, and
        // ensure that it is not excessively large or small
        col_scale_value = pow(2.0, floor(log(col_scale_value) / log2 + 0.5));
        col_scale_value =
            min(max(min_allow_col_scale, col_scale_value), max_allow_col_scale);
        col_scale[iCol] = col_scale_value;
        // Scale the column
        for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
             iEl++)
          this->value_[iEl] *= col_scale[iCol];
      } else {
        // Empty column
        col_scale[iCol] = 1;
      }
    }
  } else {
    assert(1 == 0);
  }
}